

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

pair<Polynom<Rational>,_Polynom<Rational>_> * __thiscall
Polynom<Rational>::ordinalDiv
          (pair<Polynom<Rational>,_Polynom<Rational>_> *__return_storage_ptr__,
          Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  Rational *pRVar4;
  bool bVar5;
  compare_t cVar6;
  matrix_error *this_00;
  pointer *ppuVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  BigInteger *this_01;
  Polynom<Rational> rem;
  Matrix<Rational> m;
  BigInteger l;
  BigInteger r;
  Polynom<Rational> res_1;
  Polynom<Rational> res;
  BigInteger local_158;
  BigInteger local_138;
  pair<Polynom<Rational>,_Polynom<Rational>_> *local_118;
  Matrix<Rational> local_110;
  BigInteger local_100;
  ulong local_e0;
  Polynom<Rational> *local_d8;
  BigInteger local_d0;
  Polynom<Rational> *local_b0;
  BigInteger local_a8;
  BigInteger local_88;
  ulong local_68;
  Matrix<Rational> local_60;
  BigInteger local_50;
  
  this_01 = &local_158;
  local_118 = __return_storage_ptr__;
  bVar5 = isOrdinal(this);
  if ((bVar5) && (bVar5 = isOrdinal(a), bVar5)) {
    uVar1 = (a->m).N;
    uVar11 = (ulong)uVar1;
    if (uVar11 != 0) {
      ppuVar7 = &(((a->m).arr)->_numerator).digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar10 = uVar11;
      do {
        if (((_Vector_impl_data *)(ppuVar7 + -1))->_M_start != *ppuVar7) {
          if (0 < (int)uVar10) {
            uVar2 = (this->m).N;
            iVar8 = -1;
            if ((ulong)uVar2 == 0) goto LAB_0013f956;
            ppuVar7 = &(((this->m).arr)->_numerator).digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            uVar10 = 0;
            goto LAB_0013f938;
          }
          break;
        }
        ppuVar7 = ppuVar7 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Ordinal division by zero");
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  while( true ) {
    uVar10 = uVar10 + 1;
    ppuVar7 = ppuVar7 + 8;
    if (uVar2 == uVar10) break;
LAB_0013f938:
    if (((_Vector_impl_data *)(ppuVar7 + -1))->_M_start != *ppuVar7) {
      iVar8 = ~(uint)uVar10 + uVar2;
      break;
    }
  }
LAB_0013f956:
  if (-1 < iVar8) {
    iVar9 = -1;
    if (uVar11 != 0) {
      ppuVar7 = &(((a->m).arr)->_numerator).digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar10 = 0;
      do {
        if (((_Vector_impl_data *)(ppuVar7 + -1))->_M_start != *ppuVar7) {
          iVar9 = ~(uint)uVar10 + uVar1;
          break;
        }
        uVar10 = uVar10 + 1;
        ppuVar7 = ppuVar7 + 8;
      } while (uVar11 != uVar10);
    }
    if (iVar9 <= iVar8) {
      local_d8 = a;
      Matrix<Rational>::Matrix(&local_110,1,iVar8 + 1U);
      uVar11 = 0;
      local_b0 = this;
      local_68 = (ulong)(iVar8 + 1U);
      do {
        BigInteger::BigInteger(&local_100,0);
        BigInteger::BigInteger(&local_d0,1);
        local_e0 = uVar11;
LAB_0013fa1b:
        BigInteger::BigInteger(&local_a8,1);
        ::operator-(&local_88,&local_d0,&local_a8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_158.digits,&local_88.digits);
        local_158.negative = local_88.negative;
        BigInteger::BigInteger(&local_138,1);
        pRVar4 = local_110.arr;
        puVar3 = local_110.arr[uVar11]._numerator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_110.arr[uVar11]._numerator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ppuVar7 = &local_110.arr[uVar11]._numerator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar7 = local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        ppuVar7[1] = local_158.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        pRVar4[uVar11]._numerator.negative = local_158.negative;
        puVar3 = pRVar4[uVar11]._denominator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pRVar4[uVar11]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pRVar4[uVar11]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        pRVar4[uVar11]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        pRVar4[uVar11]._denominator.negative = local_138.negative;
        if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_158.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_88.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_a8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Polynom((Polynom<Rational> *)&local_158,&local_110);
        ordinalMul((Polynom<Rational> *)&local_88,local_d8);
        cVar6 = ordinalCmp(this,(Polynom<Rational> *)&local_88);
        if (cVar6 == CMP_LESS) {
          iVar8 = 5;
LAB_0013fbac:
          bVar5 = false;
        }
        else {
          if (cVar6 == CMP_EQUAL) {
            Polynom((Polynom<Rational> *)&local_a8);
            std::pair<Polynom<Rational>,_Polynom<Rational>_>::
            pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                      (local_118,(Polynom<Rational> *)&local_158,(Polynom<Rational> *)&local_a8);
            Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_a8);
            iVar8 = 1;
            goto LAB_0013fbac;
          }
          iVar8 = 0;
          bVar5 = true;
        }
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_88);
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
        this = local_b0;
        if (iVar8 == 0) {
          BigInteger::BigInteger(&local_50,2);
          BigInteger::operator*=(&local_d0,&local_50);
          this = local_b0;
          if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          goto LAB_0013fa1b;
        }
        uVar10 = local_e0;
        if (iVar8 == 5) {
          do {
            BigInteger::BigInteger(&local_88,1);
            ::operator+(&local_158,&local_100,&local_88);
            cVar6 = BigInteger::_compare(&local_158,&local_d0);
            if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_158.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_88.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (cVar6 != CMP_LESS) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_158.digits,&local_100.digits);
              local_158.negative = local_100.negative;
              BigInteger::BigInteger(&local_138,1);
              pRVar4 = local_110.arr;
              puVar3 = local_110.arr[uVar11]._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_110.arr[uVar11]._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              ppuVar7 = &local_110.arr[uVar11]._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar7 = local_158.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              ppuVar7[1] = local_158.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar3 != (pointer)0x0) {
                operator_delete(puVar3);
              }
              pRVar4[uVar11]._numerator.negative = local_158.negative;
              puVar3 = pRVar4[uVar11]._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pRVar4[uVar11]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pRVar4[uVar11]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              pRVar4[uVar11]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar3 != (pointer)0x0) {
                operator_delete(puVar3);
              }
              uVar10 = local_e0;
              pRVar4[uVar11]._denominator.negative = local_138.negative;
              if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_158.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              bVar5 = true;
              goto LAB_0013ff75;
            }
            ::operator+(&local_158,&local_100,&local_d0);
            BigInteger::BigInteger(&local_a8,2);
            ::operator/(&local_88,&local_158,&local_a8);
            if (local_a8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_158.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_158.digits,&local_88.digits);
            local_158.negative = local_88.negative;
            BigInteger::BigInteger(&local_138,1);
            pRVar4 = local_110.arr;
            puVar3 = local_110.arr[uVar11]._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_110.arr[uVar11]._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            ppuVar7 = &local_110.arr[uVar11]._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar7 = local_158.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppuVar7[1] = local_158.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar3 != (pointer)0x0) {
              operator_delete(puVar3);
            }
            pRVar4[uVar11]._numerator.negative = local_158.negative;
            puVar3 = pRVar4[uVar11]._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pRVar4[uVar11]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pRVar4[uVar11]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            pRVar4[uVar11]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar3 != (pointer)0x0) {
              operator_delete(puVar3);
            }
            pRVar4[uVar11]._denominator.negative = local_138.negative;
            if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_158.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            Polynom((Polynom<Rational> *)&local_158,&local_110);
            ordinalMul((Polynom<Rational> *)&local_a8,local_d8);
            cVar6 = ordinalCmp(this,(Polynom<Rational> *)&local_a8);
            if (cVar6 == CMP_EQUAL) {
              Polynom((Polynom<Rational> *)&local_60);
              std::pair<Polynom<Rational>,_Polynom<Rational>_>::
              pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                        (local_118,(Polynom<Rational> *)&local_158,(Polynom<Rational> *)&local_60);
              Matrix<Rational>::~Matrix(&local_60);
            }
            else if (cVar6 == CMP_LESS) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_d0.digits,&local_88.digits);
              local_d0.negative = local_88.negative;
            }
            else {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_100.digits,&local_88.digits);
              local_100.negative = local_88.negative;
            }
            Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_a8);
            Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
            if (local_88.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          } while (cVar6 != CMP_EQUAL);
          bVar5 = false;
          uVar10 = local_e0;
        }
LAB_0013ff75:
        if (local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_100.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar5) goto LAB_00140039;
        uVar11 = uVar10 + 1;
      } while (uVar11 != local_68);
      Polynom((Polynom<Rational> *)&local_d0,&local_110);
      ordinalMul((Polynom<Rational> *)&local_100,local_d8);
      ordinalSub((Polynom<Rational> *)&local_158,this);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_100);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_d0);
      Polynom((Polynom<Rational> *)&local_100,&local_110);
      std::pair<Polynom<Rational>,_Polynom<Rational>_>::
      pair<Polynom<Rational>,_Polynom<Rational>_&,_true>
                (local_118,(Polynom<Rational> *)&local_100,(Polynom<Rational> *)&local_158);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_100);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
LAB_00140039:
      this_01 = (BigInteger *)&local_110;
      goto LAB_0014003e;
    }
  }
  Polynom((Polynom<Rational> *)&local_158);
  std::pair<Polynom<Rational>,_Polynom<Rational>_>::pair<Polynom<Rational>,_true>
            (local_118,(Polynom<Rational> *)&local_158,this);
LAB_0014003e:
  Matrix<Rational>::~Matrix((Matrix<Rational> *)this_01);
  return local_118;
}

Assistant:

const std::pair<Polynom<Field>, Polynom<Field>> Polynom<Field>::ordinalDiv(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        throw matrix_error("Ordinal division by zero");
    int d = degree();
    if(d < 0 || d < a.degree())
        return {Polynom(), *this};
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    Polynom rem = ordinalSub(a.ordinalMul(Polynom(m)));
    return {Polynom(m), rem};
}